

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

MatrixXd * __thiscall ChebTools::LMatrixLibrary::get(LMatrixLibrary *this,size_t N)

{
  iterator iVar1;
  size_t local_18;
  
  local_18 = N;
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::_Select1st<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
          ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::_Select1st<std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)this,&local_18);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->matrices)._M_t._M_impl.super__Rb_tree_header) {
    build(this,local_18);
    iVar1 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::_Select1st<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
            ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::_Select1st<std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)this,&local_18);
  }
  return (MatrixXd *)&iVar1._M_node[1]._M_parent;
}

Assistant:

const Eigen::MatrixXd & get(std::size_t N) {
            auto it = matrices.find(N);
            if (it != matrices.end()) {
                return it->second;
            }
            else {
                build(N);
                return matrices.find(N)->second;
            }
        }